

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int RoundScalarWithFormat<int,int>(char *format,ImGuiDataType data_type,int v)

{
  double dVar1;
  char **local_70;
  char *p;
  char v_str [64];
  char *fmt_start;
  int v_local;
  ImGuiDataType data_type_local;
  char *format_local;
  
  fmt_start._0_4_ = v;
  fmt_start._4_4_ = data_type;
  _v_local = format;
  v_str._56_8_ = ImParseFormatFindStart(format);
  if ((*(char *)v_str._56_8_ == '%') && (*(char *)(v_str._56_8_ + 1) != '%')) {
    ImFormatString((char *)&p,0x40,(char *)v_str._56_8_,(ulong)(uint)fmt_start);
    for (local_70 = &p; *(char *)local_70 == ' '; local_70 = (char **)((long)local_70 + 1)) {
    }
    if ((fmt_start._4_4_ == 4) || (fmt_start._4_4_ == 5)) {
      dVar1 = ImAtof((char *)local_70);
      fmt_start._0_4_ = (uint)dVar1;
    }
    else {
      ImAtoi<int>((char *)local_70,(int *)&fmt_start);
    }
    format_local._4_4_ = (uint)fmt_start;
  }
  else {
    format_local._4_4_ = (uint)fmt_start;
  }
  return format_local._4_4_;
}

Assistant:

static inline TYPE RoundScalarWithFormat(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}